

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O2

int __thiscall TCPController::poll(TCPController *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  iterator iVar1;
  __shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  nfds_t nVar3;
  int iVar4;
  pollfd pfd;
  shared_lock<std::shared_mutex> lock;
  mapped_type conn;
  pollfd local_58;
  shared_lock<std::shared_mutex> local_50;
  __shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  nVar3 = 0;
  iVar4 = 0;
  do {
    for (; nVar3 != __nfds; nVar3 = nVar3 + 1) {
      local_58 = __fds[nVar3];
      local_50._M_owns = true;
      local_50._M_pm = &this->mutex_;
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
      iVar1 = std::
              _Hashtable<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->connections)._M_h,&local_58.fd);
      if (iVar1.
          super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>.
          _M_cur != (__node_type *)0x0) {
        p_Var2 = &std::__detail::
                  _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->connections,&local_58.fd)->
                  super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var2)
        ;
        std::shared_lock<std::shared_mutex>::unlock(&local_50);
        if ((ushort)(local_58.events & (local_40._M_ptr)->poll_flags_) != 0) {
          __fds[nVar3].revents = (local_40._M_ptr)->poll_flags_;
          iVar4 = iVar4 + 1;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
      std::shared_lock<std::shared_mutex>::~shared_lock(&local_50);
    }
    nVar3 = 0;
  } while (iVar4 < 1);
  return iVar4;
}

Assistant:

int TCPController::poll(struct pollfd *fds, nfds_t nfds, int timeout) {
    int total_polls = 0;
    while (true) {
        for (int i = 0; i < nfds; i++) {
            struct pollfd pfd = fds[i];
            std::shared_lock lock(mutex_);
            if (connections.find(pfd.fd) != connections.end()) {
//                std::cout << "query on fd " << pfd.fd << "for event " << pfd.events << std::endl;
                auto conn = connections[pfd.fd];
                lock.unlock();
//                short flags = 0;
//                if (conn->hasRead()) {
//                    flags |= (POLLRDNORM | POLLRDBAND | POLLIN | POLLPRI);
//                }
//                flags |= (POLLOUT | POLLWRNORM | POLLWRBAND);
                if ((conn->hasRead() & pfd.events) != 0) {
//                    std::cout << "return on fd " << pfd.fd << "for event " << conn->hasRead() << std::endl;
                    fds[i].revents = conn->hasRead();
                    total_polls++;
                }
            }
        }
        if (total_polls > 0) {
            break;
        }

    }
    return total_polls;
}